

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O3

void __thiscall DPlat::Serialize(DPlat *this,FArchive *arc)

{
  FArchive *pFVar1;
  BYTE val;
  BYTE val_1;
  BYTE val_2;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  DMover::Serialize((DMover *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->m_Speed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Low);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_High);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Wait);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Count);
  local_1b = (undefined1)this->m_Status;
  FArchive::operator<<(pFVar1,&local_1b);
  this->m_Status = (uint)(byte)local_1b;
  local_1a = (undefined1)this->m_OldStatus;
  FArchive::operator<<(pFVar1,&local_1a);
  this->m_OldStatus = (uint)(byte)local_1a;
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Crush);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Tag);
  local_19 = (undefined1)this->m_Type;
  FArchive::operator<<(pFVar1,&local_19);
  this->m_Type = (uint)(byte)local_19;
  return;
}

Assistant:

void DPlat::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Speed
		<< m_Low
		<< m_High
		<< m_Wait
		<< m_Count
		<< m_Status
		<< m_OldStatus
		<< m_Crush
		<< m_Tag
		<< m_Type;
}